

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_common.c
# Opt level: O2

void jpegd_write_qp_ac_dc_table(JpegdHalCtx *ctx,JpegdSyntax *syntax)

{
  byte bVar1;
  RK_U32 RVar2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  AcTable *pAVar9;
  DcTable *pDVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  RK_U8 table_tmp [64];
  
  if (((byte)jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEGD_COMMON","enter\n","jpegd_write_qp_ac_dc_table");
  }
  iVar6 = 4;
  puVar3 = (uint *)mpp_buffer_get_ptr_with_caller(ctx->pTableBase,"jpegd_write_qp_ac_dc_table");
  table_tmp[0x30] = '\0';
  table_tmp[0x31] = '\0';
  table_tmp[0x32] = '\0';
  table_tmp[0x33] = '\0';
  table_tmp[0x34] = '\0';
  table_tmp[0x35] = '\0';
  table_tmp[0x36] = '\0';
  table_tmp[0x37] = '\0';
  table_tmp[0x38] = '\0';
  table_tmp[0x39] = '\0';
  table_tmp[0x3a] = '\0';
  table_tmp[0x3b] = '\0';
  table_tmp[0x3c] = '\0';
  table_tmp[0x3d] = '\0';
  table_tmp[0x3e] = '\0';
  table_tmp[0x3f] = '\0';
  table_tmp[0x20] = '\0';
  table_tmp[0x21] = '\0';
  table_tmp[0x22] = '\0';
  table_tmp[0x23] = '\0';
  table_tmp[0x24] = '\0';
  table_tmp[0x25] = '\0';
  table_tmp[0x26] = '\0';
  table_tmp[0x27] = '\0';
  table_tmp[0x28] = '\0';
  table_tmp[0x29] = '\0';
  table_tmp[0x2a] = '\0';
  table_tmp[0x2b] = '\0';
  table_tmp[0x2c] = '\0';
  table_tmp[0x2d] = '\0';
  table_tmp[0x2e] = '\0';
  table_tmp[0x2f] = '\0';
  table_tmp[0x10] = '\0';
  table_tmp[0x11] = '\0';
  table_tmp[0x12] = '\0';
  table_tmp[0x13] = '\0';
  table_tmp[0x14] = '\0';
  table_tmp[0x15] = '\0';
  table_tmp[0x16] = '\0';
  table_tmp[0x17] = '\0';
  table_tmp[0x18] = '\0';
  table_tmp[0x19] = '\0';
  table_tmp[0x1a] = '\0';
  table_tmp[0x1b] = '\0';
  table_tmp[0x1c] = '\0';
  table_tmp[0x1d] = '\0';
  table_tmp[0x1e] = '\0';
  table_tmp[0x1f] = '\0';
  table_tmp[0] = '\0';
  table_tmp[1] = '\0';
  table_tmp[2] = '\0';
  table_tmp[3] = '\0';
  table_tmp[4] = '\0';
  table_tmp[5] = '\0';
  table_tmp[6] = '\0';
  table_tmp[7] = '\0';
  table_tmp[8] = '\0';
  table_tmp[9] = '\0';
  table_tmp[10] = '\0';
  table_tmp[0xb] = '\0';
  table_tmp[0xc] = '\0';
  table_tmp[0xd] = '\0';
  table_tmp[0xe] = '\0';
  table_tmp[0xf] = '\0';
  bVar1 = syntax->qtable_cnt;
  uVar5 = 0;
  for (uVar8 = 0; uVar8 != bVar1; uVar8 = uVar8 + 1) {
    uVar13 = syntax->quant_index[uVar8];
    for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 1) {
      table_tmp[""[lVar12]] = (RK_U8)syntax->quant_matrixes[uVar13][lVar12];
    }
    for (uVar11 = 0; uVar11 < 0x40; uVar11 = uVar11 + 4) {
      uVar5 = *(uint *)(table_tmp + uVar11);
      uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      *(uint *)((long)puVar3 + uVar11) = uVar5;
    }
    puVar3 = (uint *)((long)puVar3 + uVar11);
  }
  RVar2 = syntax->ac_index[0];
  pAVar9 = syntax->ac_table + 1;
  if (RVar2 == 0) {
    pAVar9 = syntax->ac_table;
  }
  iVar7 = 0x20;
  for (uVar8 = 0; uVar8 != 0xa2; uVar8 = uVar8 + 1) {
    uVar13 = 0;
    if (uVar8 < pAVar9->actual_length) {
      uVar13 = (uint)(byte)pAVar9->vals[uVar8];
    }
    iVar4 = iVar7 + -8;
    uVar14 = uVar13 << ((byte)iVar4 & 0x1f) | uVar5;
    uVar5 = uVar13 << 0x18;
    if (iVar7 != 0x20) {
      uVar5 = uVar14;
    }
    if (iVar4 == 0) {
      *puVar3 = uVar14;
      puVar3 = puVar3 + 1;
      iVar4 = 0x20;
    }
    iVar7 = iVar4;
  }
  pAVar9 = syntax->ac_table;
  if (RVar2 == 0) {
    pAVar9 = syntax->ac_table + 1;
  }
  for (uVar8 = 0; uVar8 != 0xa2; uVar8 = uVar8 + 1) {
    uVar13 = 0;
    if ((syntax->yuv_mode != 0) && (uVar8 < pAVar9->actual_length)) {
      uVar13 = (uint)(byte)pAVar9->vals[uVar8];
    }
    iVar4 = iVar7 + -8;
    uVar14 = uVar13 << ((byte)iVar4 & 0x1f) | uVar5;
    uVar5 = uVar13 << 0x18;
    if (iVar7 != 0x20) {
      uVar5 = uVar14;
    }
    iVar7 = iVar4;
    if (iVar4 == 0) {
      *puVar3 = uVar14;
      puVar3 = puVar3 + 1;
      iVar7 = 0x20;
    }
  }
  RVar2 = syntax->dc_index[0];
  pDVar10 = syntax->dc_table + 1;
  if (RVar2 == 0) {
    pDVar10 = syntax->dc_table;
  }
  for (uVar8 = 0; uVar8 != 0xc; uVar8 = uVar8 + 1) {
    uVar13 = 0;
    if (uVar8 < pDVar10->actual_length) {
      uVar13 = (uint)(byte)pDVar10->vals[uVar8];
    }
    iVar4 = iVar7 + -8;
    uVar14 = uVar13 << ((byte)iVar4 & 0x1f) | uVar5;
    uVar5 = uVar13 << 0x18;
    if (iVar7 != 0x20) {
      uVar5 = uVar14;
    }
    iVar7 = iVar4;
    if (iVar4 == 0) {
      *puVar3 = uVar14;
      puVar3 = puVar3 + 1;
      iVar7 = 0x20;
    }
  }
  pDVar10 = syntax->dc_table;
  if (RVar2 == 0) {
    pDVar10 = syntax->dc_table + 1;
  }
  for (uVar8 = 0; uVar8 != 0xc; uVar8 = uVar8 + 1) {
    uVar13 = 0;
    if ((syntax->yuv_mode != 0) && (uVar8 < pDVar10->actual_length)) {
      uVar13 = (uint)(byte)pDVar10->vals[uVar8];
    }
    iVar4 = iVar7 + -8;
    uVar14 = uVar13 << ((byte)iVar4 & 0x1f) | uVar5;
    uVar5 = uVar13 << 0x18;
    if (iVar7 != 0x20) {
      uVar5 = uVar14;
    }
    iVar7 = iVar4;
    if (iVar4 == 0) {
      *puVar3 = uVar14;
      puVar3 = puVar3 + 1;
      iVar7 = 0x20;
    }
  }
  while (uVar13 = uVar5, bVar15 = iVar6 != 0, iVar6 = iVar6 + -1, bVar15) {
    uVar5 = uVar13;
    if (iVar7 == 0x20) {
      uVar5 = 0;
    }
    iVar7 = iVar7 + -8;
    if (iVar7 == 0) {
      *puVar3 = uVar13;
      puVar3 = puVar3 + 1;
      iVar7 = 0x20;
    }
  }
  if (((byte)jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEGD_COMMON","exit\n","jpegd_write_qp_ac_dc_table");
    return;
  }
  return;
}

Assistant:

void jpegd_write_qp_ac_dc_table(JpegdHalCtx *ctx,
                                JpegdSyntax*syntax)
{
    jpegd_dbg_func("enter\n");
    JpegdSyntax *s = syntax;
    RK_U32 *base = (RK_U32 *)mpp_buffer_get_ptr(ctx->pTableBase);
    RK_U8 table_tmp[QUANTIZE_TABLE_LENGTH] = {0};
    RK_U32 idx, table_word = 0, table_value = 0;
    RK_U32 shifter = 32;
    AcTable *ac_ptr0 = NULL, *ac_ptr1 = NULL;
    DcTable *dc_ptr0 = NULL, *dc_ptr1 = NULL;
    RK_U32 i, j = 0;

    /* Quantize tables for all components
     * length = 64 * 3  (Bytes)
     */
    for (j = 0; j < s->qtable_cnt; j++) {
        idx = s->quant_index[j]; /* quantize table index used by j component */

        for (i = 0; i < QUANTIZE_TABLE_LENGTH; i++) {
            table_tmp[zzOrder[i]] = (RK_U8) s->quant_matrixes[idx][i];
        }

        /* could memcpy be OK?? */
        for (i = 0; i < QUANTIZE_TABLE_LENGTH; i += 4) {
            /* transfer to big endian */
            table_word = (table_tmp[i] << 24) |
                         (table_tmp[i + 1] << 16) |
                         (table_tmp[i + 2] << 8) |
                         table_tmp[i + 3];
            *base = table_word;
            base++;
        }
    }

    /* write AC and DC tables
     * memory:  AC(Y) - AC(UV) - DC(Y) - DC(UV)
     * length = 162   + 162    + 12    + 12   (Bytes)
     */
    {
        /* this trick is done because hardware always wants
         * luma table as ac hardware table 0 */
        if (s->ac_index[0] == HUFFMAN_TABLE_ID_ZERO) {
            /* Luma's AC uses Huffman table zero */
            ac_ptr0 = &(s->ac_table[HUFFMAN_TABLE_ID_ZERO]);
            ac_ptr1 = &(s->ac_table[HUFFMAN_TABLE_ID_ONE]);
        } else {
            ac_ptr0 = &(s->ac_table[HUFFMAN_TABLE_ID_ONE]);
            ac_ptr1 = &(s->ac_table[HUFFMAN_TABLE_ID_ZERO]);
        }

        /* write luma AC table */
        for (i = 0; i < MAX_AC_HUFFMAN_TABLE_LENGTH; i++) {
            if (i < ac_ptr0->actual_length)
                table_value = (RK_U8) ac_ptr0->vals[i];
            else
                table_value = 0;

            /* transfer to big endian */
            if (shifter == 32)
                table_word = (table_value << (shifter - 8));
            else
                table_word |= (table_value << (shifter - 8));

            shifter -= 8;
            if (shifter == 0) {
                /* write 4 Bytes(32 bit) */
                *base = table_word;
                base++;
                shifter = 32;
            }
        }

        /* write chroma AC table */
        for (i = 0; i < MAX_AC_HUFFMAN_TABLE_LENGTH; i++) {
            /* chroma's AC table must be zero for YUV400 */
            if ((s->yuv_mode != JPEGDEC_YUV400) && (i < ac_ptr1->actual_length))
                table_value = (RK_U8) ac_ptr1->vals[i];
            else
                table_value = 0;

            /* transfer to big endian */
            if (shifter == 32)
                table_word = (table_value << (shifter - 8));
            else
                table_word |= (table_value << (shifter - 8));

            shifter -= 8;
            if (shifter == 0) {
                /* write 4 Bytes(32 bit) */
                *base = table_word;
                base++;
                shifter = 32;
            }
        }

        /* this trick is done because hardware always wants
         * luma table as dc hardware table 0 */
        if (s->dc_index[0] == HUFFMAN_TABLE_ID_ZERO) {
            /* Luma's DC uses Huffman table zero */
            dc_ptr0 = &(s->dc_table[HUFFMAN_TABLE_ID_ZERO]);
            dc_ptr1 = &(s->dc_table[HUFFMAN_TABLE_ID_ONE]);
        } else {
            dc_ptr0 = &(s->dc_table[HUFFMAN_TABLE_ID_ONE]);
            dc_ptr1 = &(s->dc_table[HUFFMAN_TABLE_ID_ZERO]);
        }

        /* write luma DC table */
        for (i = 0; i < MAX_DC_HUFFMAN_TABLE_LENGTH; i++) {
            if (i < dc_ptr0->actual_length)
                table_value = (RK_U8) dc_ptr0->vals[i];
            else
                table_value = 0;

            /* transfer to big endian */
            if (shifter == 32)
                table_word = (table_value << (shifter - 8));
            else
                table_word |= (table_value << (shifter - 8));

            shifter -= 8;
            if (shifter == 0) {
                /* write 4 Bytes(32 bit) */
                *base = table_word;
                base++;
                shifter = 32;
            }
        }

        /* write chroma DC table */
        for (i = 0; i < MAX_DC_HUFFMAN_TABLE_LENGTH; i++) {
            /* chroma's DC table must be zero for YUV400 */
            if ((s->yuv_mode != JPEGDEC_YUV400) && (i < dc_ptr1->actual_length))
                table_value = (RK_U8) dc_ptr1->vals[i];
            else
                table_value = 0;

            /* transfer to big endian */
            if (shifter == 32)
                table_word = (table_value << (shifter - 8));
            else
                table_word |= (table_value << (shifter - 8));

            shifter -= 8;
            if (shifter == 0) {
                /* write 4 Bytes(32 bit) */
                *base = table_word;
                base++;
                shifter = 32;
            }
        }
    }

    /* four-byte padding zero */
    for (i = 0; i < 4; i++) {
        table_value = 0;

        if (shifter == 32)
            table_word = (table_value << (shifter - 8));
        else
            table_word |= (table_value << (shifter - 8));

        shifter -= 8;

        if (shifter == 0) {
            *base = table_word;
            base++;
            shifter = 32;
        }
    }
    jpegd_dbg_func("exit\n");
    return;
}